

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

int check_default(lys_type *type,char **value,lys_module *module,int tpdf)

{
  LY_ERR *pLVar1;
  char *pcVar2;
  lys_type *plVar3;
  int local_8c;
  lyd_node *plStack_88;
  int ret;
  char *dflt;
  lyd_node_leaf_list node;
  lys_tpdf *base_tpdf;
  int tpdf_local;
  lys_module *module_local;
  char **value_local;
  lys_type *type_local;
  
  node.value_type = 0;
  node._66_6_ = 0;
  plStack_88 = (lyd_node *)0x0;
  local_8c = 0;
  if (value == (char **)0x0) {
    __assert_fail("value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                  ,0xbdf,
                  "int check_default(struct lys_type *, const char **, struct lys_module *, int)");
  }
  if (type->base < LY_TYPE_BINARY) {
    return 1;
  }
  if ((type->base == LY_TYPE_LEAFREF) && (tpdf != 0)) {
    return 0;
  }
  plStack_88 = (lyd_node *)*value;
  if (plStack_88 == (lyd_node *)0x0) {
    for (node._64_8_ = type->der; *(long *)(node._64_8_ + 0x50) != 0;
        node._64_8_ = *(undefined8 *)(node._64_8_ + 0x50)) {
      if (*(long *)(node._64_8_ + 0x78) != 0) {
        plStack_88 = *(lyd_node **)(node._64_8_ + 0x78);
        break;
      }
    }
    if (plStack_88 == (lyd_node *)0x0) {
      return 0;
    }
    switch(type->base) {
    case LY_TYPE_BINARY:
      if ((type->info).bits.bit == (lys_type_bit *)0x0) {
        return 0;
      }
      break;
    case LY_TYPE_BITS:
      if ((type->info).bits.count == 0) {
        return 0;
      }
      break;
    case LY_TYPE_BOOL:
    case LY_TYPE_EMPTY:
    case LY_TYPE_IDENT:
    case LY_TYPE_INST:
    case LY_TYPE_LEAFREF:
      return 0;
    case LY_TYPE_DEC64:
      if ((type->info).bits.bit == (lys_type_bit *)0x0) {
        return 0;
      }
      break;
    case LY_TYPE_ENUM:
      if ((type->info).bits.count == 0) {
        return 0;
      }
      break;
    case LY_TYPE_STRING:
      if (((type->info).bits.bit == (lys_type_bit *)0x0) &&
         ((type->info).lref.target == (lys_node_leaf *)0x0)) {
        return 0;
      }
      break;
    case LY_TYPE_UNION:
      break;
    case LY_TYPE_INT8:
    case LY_TYPE_UINT8:
    case LY_TYPE_INT16:
    case LY_TYPE_UINT16:
    case LY_TYPE_INT32:
    case LY_TYPE_UINT32:
    case LY_TYPE_INT64:
    case LY_TYPE_UINT64:
      if ((type->info).bits.bit == (lys_type_bit *)0x0) {
        return 0;
      }
      break;
    default:
      pLVar1 = ly_errno_location();
      *pLVar1 = LY_EINT;
      ly_log(LY_LLERR,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
             ,0xc2c);
      return -1;
    }
  }
  else if (type->base == LY_TYPE_EMPTY) {
    ly_vlog(LYE_INCHILDSTMT,LY_VLOG_NONE,(void *)0x0,"default",type->parent->name);
    ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"The \"empty\" data type cannot have a default value."
           );
    return -1;
  }
  memset(&dflt,0,0x48);
  node.parent = plStack_88;
  node.value.int16 = (int16_t)type->base;
  dflt = (char *)calloc(1,200);
  if (dflt == (char *)0x0) {
    pLVar1 = ly_errno_location();
    *pLVar1 = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","check_default");
    type_local._4_4_ = -1;
  }
  else {
    pcVar2 = strdup("fake-default");
    *(char **)dflt = pcVar2;
    if (*(long *)dflt == 0) {
      pLVar1 = ly_errno_location();
      *pLVar1 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","check_default");
      free(dflt);
      type_local._4_4_ = -1;
    }
    else {
      *(lys_module **)(dflt + 0x30) = module;
      memcpy(dflt + 0x78,type,0x40);
      if (type->base == LY_TYPE_LEAFREF) {
        if ((type->info).lref.target == (lys_node_leaf *)0x0) {
          local_8c = 1;
        }
        else {
          local_8c = check_default(&((type->info).lref.target)->type,
                                   (char **)&stack0xffffffffffffff78,module,0);
          if ((local_8c == 0) && (*value != (char *)0x0)) {
            *value = (char *)plStack_88;
          }
        }
      }
      else {
        plVar3 = lyp_parse_value((lys_type *)(dflt + 0x78),(char **)&node.parent,(lyxml_elem *)0x0,
                                 (lyd_node_leaf_list *)&dflt,(lyd_attr *)0x0,1,1);
        if (plVar3 == (lys_type *)0x0) {
          local_8c = 1;
          if ((node._64_8_ != 0) &&
             (((type->base == LY_TYPE_BITS && ((type->der->type).der != (lys_tpdf *)0x0)) ||
              ((type->base == LY_TYPE_ENUM && ((type->der->type).der != (lys_tpdf *)0x0)))))) {
            ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
                    "Invalid value \"%s\" of the default statement inherited to \"%s\" from \"%s\" base type."
                    ,plStack_88,type->parent->name,*(undefined8 *)node._64_8_);
          }
        }
        else if (plStack_88 != node.parent) {
          if (plStack_88 != (lyd_node *)*value) {
            __assert_fail("dflt == *value",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                          ,0xc66,
                          "int check_default(struct lys_type *, const char **, struct lys_module *, int)"
                         );
          }
          *value = (char *)node.parent;
        }
      }
      if (node.value.int16 == 2) {
        free(node.value_str);
      }
      free(*(void **)dflt);
      free(dflt);
      type_local._4_4_ = local_8c;
    }
  }
  return type_local._4_4_;
}

Assistant:

static int
check_default(struct lys_type *type, const char **value, struct lys_module *module, int tpdf)
{
    struct lys_tpdf *base_tpdf = NULL;
    struct lyd_node_leaf_list node;
    const char *dflt = NULL;
    int ret = EXIT_SUCCESS;

    assert(value);

    if (type->base <= LY_TYPE_DER) {
        /* the type was not resolved yet, nothing to do for now */
        return EXIT_FAILURE;
    } else if (type->base == LY_TYPE_LEAFREF && tpdf) {
        /* leafref in typedef cannot be checked */
        return EXIT_SUCCESS;
    }

    dflt = *value;
    if (!dflt) {
        /* we do not have a new default value, so is there any to check even, in some base type? */
        for (base_tpdf = type->der; base_tpdf->type.der; base_tpdf = base_tpdf->type.der) {
            if (base_tpdf->dflt) {
                dflt = base_tpdf->dflt;
                break;
            }
        }

        if (!dflt) {
            /* no default value, nothing to check, all is well */
            return EXIT_SUCCESS;
        }

        /* so there is a default value in a base type, but can the default value be no longer valid (did we define some new restrictions)? */
        switch (type->base) {
        case LY_TYPE_IDENT:
        case LY_TYPE_INST:
        case LY_TYPE_LEAFREF:
        case LY_TYPE_BOOL:
        case LY_TYPE_EMPTY:
            /* these have no restrictions, so we would do the exact same work as the unres in the base typedef */
            return EXIT_SUCCESS;
        case LY_TYPE_BITS:
            /* the default value must match the restricted list of values, if the type was restricted */
            if (type->info.bits.count) {
                break;
            }
            return EXIT_SUCCESS;
        case LY_TYPE_ENUM:
            /* the default value must match the restricted list of values, if the type was restricted */
            if (type->info.enums.count) {
                break;
            }
            return EXIT_SUCCESS;
        case LY_TYPE_DEC64:
            if (type->info.dec64.range) {
                break;
            }
            return EXIT_SUCCESS;
        case LY_TYPE_BINARY:
            if (type->info.binary.length) {
                break;
            }
            return EXIT_SUCCESS;
        case LY_TYPE_INT8:
        case LY_TYPE_INT16:
        case LY_TYPE_INT32:
        case LY_TYPE_INT64:
        case LY_TYPE_UINT8:
        case LY_TYPE_UINT16:
        case LY_TYPE_UINT32:
        case LY_TYPE_UINT64:
            if (type->info.num.range) {
                break;
            }
            return EXIT_SUCCESS;
        case LY_TYPE_STRING:
            if (type->info.str.length || type->info.str.patterns) {
                break;
            }
            return EXIT_SUCCESS;
        case LY_TYPE_UNION:
            /* way too much trouble learning whether we need to check the default again, so just do it */
            break;
        default:
            LOGINT;
            return -1;
        }
    } else if (type->base == LY_TYPE_EMPTY) {
        LOGVAL(LYE_INCHILDSTMT, LY_VLOG_NONE, NULL, "default", type->parent->name);
        LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "The \"empty\" data type cannot have a default value.");
        return -1;
    }

    /* dummy leaf */
    memset(&node, 0, sizeof node);
    node.value_str = dflt;
    node.value_type = type->base;
    node.schema = calloc(1, sizeof (struct lys_node_leaf));
    if (!node.schema) {
        LOGMEM;
        return -1;
    }
    node.schema->name = strdup("fake-default");
    if (!node.schema->name) {
        LOGMEM;
        free(node.schema);
        return -1;
    }
    node.schema->module = module;
    memcpy(&((struct lys_node_leaf *)node.schema)->type, type, sizeof *type);

    if (type->base == LY_TYPE_LEAFREF) {
        if (!type->info.lref.target) {
            ret = EXIT_FAILURE;
            goto finish;
        }
        ret = check_default(&type->info.lref.target->type, &dflt, module, 0);
        if (!ret) {
            /* adopt possibly changed default value to its canonical form */
            if (*value) {
                *value = dflt;
            }
        }
    } else {
        if (!lyp_parse_value(&((struct lys_node_leaf *)node.schema)->type, &node.value_str, NULL, &node, NULL, 1, 1)) {
            /* possible forward reference */
            ret = 1;
            if (base_tpdf) {
                /* default value is defined in some base typedef */
                if ((type->base == LY_TYPE_BITS && type->der->type.der) ||
                        (type->base == LY_TYPE_ENUM && type->der->type.der)) {
                    /* we have refined bits/enums */
                    LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL,
                           "Invalid value \"%s\" of the default statement inherited to \"%s\" from \"%s\" base type.",
                           dflt, type->parent->name, base_tpdf->name);
                }
            }
        } else {
            /* success - adopt canonical form from the node into the default value */
            if (dflt != node.value_str) {
                /* this can happen only if we have non-inherited default value,
                 * inherited default values are already in canonical form */
                assert(dflt == *value);
                *value = node.value_str;
            }
        }
    }

finish:
    if (node.value_type == LY_TYPE_BITS) {
        free(node.value.bit);
    }
    free((char *)node.schema->name);
    free(node.schema);

    return ret;
}